

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_extrh_i64_i32_ppc64(TCGContext_conflict10 *tcg_ctx,TCGv_i32 ret,TCGv_i64 arg)

{
  TCGv_i64 ret_00;
  TCGv_i64 t;
  TCGv_i64 arg_local;
  TCGv_i32 ret_local;
  TCGContext_conflict10 *tcg_ctx_local;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_shri_i64_ppc64(tcg_ctx,ret_00,arg,0x20);
  tcg_gen_mov_i32(tcg_ctx,ret,(TCGv_i32)ret_00);
  tcg_temp_free_i64(tcg_ctx,ret_00);
  return;
}

Assistant:

void tcg_gen_extrh_i64_i32(TCGContext *tcg_ctx, TCGv_i32 ret, TCGv_i64 arg)
{
#if TCG_TARGET_REG_BITS == 32
        tcg_gen_mov_i32(tcg_ctx, ret, TCGV_HIGH(tcg_ctx, arg));
#elif TCG_TARGET_HAS_extrh_i64_i32
        tcg_gen_op2(tcg_ctx, INDEX_op_extrh_i64_i32,
                    tcgv_i32_arg(tcg_ctx, ret), tcgv_i64_arg(tcg_ctx, arg));
#else
        TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_shri_i64(tcg_ctx, t, arg, 32);
        tcg_gen_mov_i32(tcg_ctx, ret, (TCGv_i32)t);
        tcg_temp_free_i64(tcg_ctx, t);
#endif
}